

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::IsEnabledStateTestCase::IsEnabledStateTestCase
          (IsEnabledStateTestCase *this,Context *context,QueryType verifier,char *name,
          char *description,GLenum targetName,bool initial,ApiType minimumContextVersion)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *log;
  bool initial_local;
  GLenum targetName_local;
  char *description_local;
  char *name_local;
  QueryType verifier_local;
  Context *context_local;
  IsEnabledStateTestCase *this_local;
  ApiType minimumContextVersion_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  pRVar2 = gles31::Context::getRenderContext(context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  this_00 = gles31::Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IsEnabledStateTestCase_032b6f38;
  *(GLenum *)&(this->super_CallLogWrapper).field_0x14 = targetName;
  this->m_initial = initial;
  this->m_verifier = verifier;
  (this->m_minimumVersion).m_bits = minimumContextVersion.m_bits;
  return;
}

Assistant:

IsEnabledStateTestCase (Context& context, QueryType verifier, const char* name, const char* description, glw::GLenum targetName, bool initial, glu::ApiType minimumContextVersion)
		: TestCase				(context, name, description)
		, glu::CallLogWrapper	(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
		, m_targetName			(targetName)
		, m_initial				(initial)
		, m_verifier			(verifier)
		, m_minimumVersion		(minimumContextVersion)
	{
	}